

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O0

void __thiscall
iDynTree::SixAxisForceTorqueSensor::SixAxisForceTorqueSensor(SixAxisForceTorqueSensor *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  JointSensor *in_stack_ffffffffffffffe0;
  SixAxisForceTorqueSensorPrivateAttributes *in_stack_fffffffffffffff0;
  
  JointSensor::JointSensor(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__SixAxisForceTorqueSensor_004fa850;
  pvVar1 = operator_new(0x160);
  SixAxisForceTorqueSensorPrivateAttributes::SixAxisForceTorqueSensorPrivateAttributes
            (in_stack_fffffffffffffff0);
  in_RDI[1] = pvVar1;
  std::__cxx11::string::operator=((string *)in_RDI[1],"");
  *(undefined8 *)(in_RDI[1] + 0x30) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI[1] + 0x28) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI[1] + 0x20) = 0xffffffffffffffff;
  return;
}

Assistant:

SixAxisForceTorqueSensor::SixAxisForceTorqueSensor()
{
    this->pimpl = new SixAxisForceTorqueSensorPrivateAttributes;

    this->pimpl->name = "";
    this->pimpl->link1 = this->pimpl->link2 = this->pimpl->appliedWrenchLink = -1;
}